

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

void __thiscall TypeFactory::saveXmlCoreTypes(TypeFactory *this,ostream *s)

{
  long *plVar1;
  undefined8 in_RAX;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(s,"<coretypes>\n",0xc);
  p_Var2 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->tree)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      plVar1 = *(long **)(p_Var2 + 1);
      if (((*(byte *)((long)plVar1 + 0x34) & 1) != 0) && (2 < *(uint *)(plVar1 + 6))) {
        uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(s,(char *)((long)&uStack_38 + 6),1);
        (**(code **)(*plVar1 + 0x58))(plVar1,s);
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(s,(char *)((long)&uStack_38 + 7),1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"</coretypes>\n",0xd);
  return;
}

Assistant:

void TypeFactory::saveXmlCoreTypes(ostream &s) const

{
  DatatypeSet::const_iterator iter;
  Datatype *ct;

  s << "<coretypes>\n";
  for(iter=tree.begin();iter!=tree.end();++iter) {
    ct = *iter;
    if (!ct->isCoreType()) continue;
    type_metatype meta = ct->getMetatype();
    if ((meta==TYPE_PTR)||(meta==TYPE_ARRAY)||
	(meta==TYPE_STRUCT))
      continue;
    s << ' ';
    ct->saveXml(s);
    s << '\n';
  }
  s << "</coretypes>\n";
}